

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

Var BailOutRecord::BailOutForElidedYield(void *framePointer)

{
  InterpreterStackFrame *this;
  bool bVar1;
  RegSlot localRegisterID;
  JavascriptCallStackLayout *pJVar2;
  FunctionBody *this_00;
  Var pvVar3;
  DynamicProfileInfo *this_01;
  void *unaff_retaddr;
  long local_58;
  JavascriptGenerator *generator;
  PushPopFrameHelper pushPopFrameHelper;
  
  pJVar2 = Js::JavascriptCallStackLayout::FromFramePointer(framePointer);
  this_00 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)pJVar2);
  bVar1 = Js::FunctionProxy::IsInDebugMode((FunctionProxy *)this_00);
  local_58 = *(long *)(pJVar2 + 0x10);
  this = *(InterpreterStackFrame **)(local_58 + 0x20);
  pushPopFrameHelper._16_8_ = *(undefined8 *)(*(long *)(this + 0x78) + 0x3b8);
  localRegisterID = Js::FunctionBody::GetYieldRegister(this_00);
  Js::InterpreterStackFrame::SetNonVarReg(this,localRegisterID,*(Var *)(pJVar2 + 0x18));
  *(long **)(this + 0xb8) = &local_58;
  Js::FunctionBody::BeginExecution(this_00);
  Js::InterpreterStackFrame::PushPopFrameHelper::PushPopFrameHelper
            ((PushPopFrameHelper *)&generator,this,unaff_retaddr,&stack0x00000000);
  if (bVar1) {
    pvVar3 = Js::InterpreterStackFrame::DebugProcess(this);
  }
  else {
    pvVar3 = Js::InterpreterStackFrame::Process(this);
  }
  Js::InterpreterStackFrame::PushPopFrameHelper::~PushPopFrameHelper
            ((PushPopFrameHelper *)&generator);
  Js::FunctionBody::EndExecution(this_00);
  if ((this_00->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
    this_01 = Js::FunctionBody::GetAnyDynamicProfileInfo(this_00);
    Js::DynamicProfileInfo::RecordImplicitCallFlags
              (this_01,*(ImplicitCallFlags *)(pushPopFrameHelper._16_8_ + 0x1570));
  }
  return pvVar3;
}

Assistant:

Js::Var BailOutRecord::BailOutForElidedYield(void * framePointer)
{
    JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(NoSaveRegistersBailOutForElidedYield);
    Js::JavascriptCallStackLayout * const layout = Js::JavascriptCallStackLayout::FromFramePointer(framePointer);
    Js::ScriptFunction ** functionRef = (Js::ScriptFunction **)&layout->functionObject;
    Js::ScriptFunction * function = *functionRef;
    Js::FunctionBody * executeFunction = function->GetFunctionBody();
#ifdef ENABLE_SCRIPT_DEBUGGING
    bool isInDebugMode = executeFunction->IsInDebugMode();
#endif

    Js::JavascriptGenerator* generator = static_cast<Js::JavascriptGenerator*>(layout->args[0]);
    Js::InterpreterStackFrame* frame = generator->GetFrame();
    ThreadContext *threadContext = frame->GetScriptContext()->GetThreadContext();

    frame->SetNonVarReg(executeFunction->GetYieldRegister(), layout->args[1]);

    // The debugger relies on comparing stack addresses of frames to decide when a step_out is complete so
    // give the InterpreterStackFrame a legit enough stack address to make this comparison work.
    frame->m_stackAddress = reinterpret_cast<DWORD_PTR>(&generator);

    executeFunction->BeginExecution();

    Js::Var aReturn = nullptr;

    {
        // Following _AddressOfReturnAddress <= real address of "returnAddress". Suffices for RemoteStackWalker to test partially initialized interpreter frame.
        Js::InterpreterStackFrame::PushPopFrameHelper pushPopFrameHelper(frame, _ReturnAddress(), _AddressOfReturnAddress());
#ifdef ENABLE_SCRIPT_DEBUGGING
        aReturn = isInDebugMode ? frame->DebugProcess() : frame->Process();
#else
        aReturn = frame->Process();
#endif
        // Note: in debug mode we always have to bailout to debug thunk,
        //       as normal interpreter thunk expects byte code compiled w/o debugging.
    }

    executeFunction->EndExecution();

    if (executeFunction->HasDynamicProfileInfo())
    {
        Js::DynamicProfileInfo *dynamicProfileInfo = executeFunction->GetAnyDynamicProfileInfo();
        dynamicProfileInfo->RecordImplicitCallFlags(threadContext->GetImplicitCallFlags());
    }

    return aReturn;
    JIT_HELPER_END(NoSaveRegistersBailOutForElidedYield);
}